

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O3

GPU_Rect GPU_MakeRect(float x,float y,float w,float h)

{
  GPU_Rect GVar1;
  
  GVar1.y = y;
  GVar1.x = x;
  GVar1.h = h;
  GVar1.w = w;
  return GVar1;
}

Assistant:

GPU_Rect GPU_MakeRect(float x, float y, float w, float h)
{
    GPU_Rect r;
    r.x = x;
    r.y = y;
    r.w = w;
    r.h = h;

    return r;
}